

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

void as197(double *inp,int N,int optmethod,int p,int d,int q,double *phi,double *theta,double *wmean
          ,double *var,double *resid,double *loglik,double *hess)

{
  double dVar1;
  int N_00;
  double *oup;
  double *xi;
  double *xf;
  undefined1 local_90 [8];
  custom_function as197_min;
  alik_object obj;
  double maxstep;
  double *x;
  double *tf;
  double *b;
  int length;
  int retval;
  int pq;
  int i;
  int q_local;
  int d_local;
  int p_local;
  int optmethod_local;
  int N_local;
  double *inp_local;
  
  oup = (double *)malloc((long)(N - d) << 3);
  as197_min.params = alik_init(p,d,q,N);
  css(inp,N,optmethod,p,d,q,phi,theta,wmean,var,resid,loglik,hess);
  if (d < 1) {
    for (retval = 0; p_local = N, retval < N; retval = retval + 1) {
      oup[retval] = inp[retval];
    }
  }
  else {
    p_local = diff(inp,N,d,oup);
  }
  *(int *)((long)as197_min.params + 0x18) = p_local;
  *(double *)((long)as197_min.params + 0x28) = *wmean;
  N_00 = *(int *)((long)as197_min.params + 0x10);
  xi = (double *)malloc((long)N_00 << 3);
  xf = (double *)malloc((long)N_00 << 3);
  for (retval = 0; retval < p; retval = retval + 1) {
    xi[retval] = phi[retval];
  }
  for (retval = 0; retval < q; retval = retval + 1) {
    xi[p + retval] = -theta[retval];
  }
  if (*(int *)((long)as197_min.params + 0x1c) == 1) {
    xi[p + q] = *(double *)((long)as197_min.params + 0x28);
  }
  for (retval = 0; retval < p_local; retval = retval + 1) {
    dVar1 = oup[retval];
    *(double *)((long)as197_min.params + (long)(p_local * 2 + retval) * 8 + 0x680) = dVar1;
    *(double *)((long)as197_min.params + (long)retval * 8 + 0x680) = dVar1;
  }
  for (retval = p_local; SBORROW4(retval,p_local * 2) != retval + p_local * -2 < 0;
      retval = retval + 1) {
    *(undefined8 *)((long)as197_min.params + (long)retval * 8 + 0x680) = 0;
  }
  local_90 = (undefined1  [8])fas197;
  as197_min.funcpt = (_func_double_double_ptr_int_void_ptr *)as197_min.params;
  fminunc((custom_function *)local_90,(custom_gradient *)0x0,N_00,xi,1.0,optmethod,xf);
  for (retval = 0; retval < N_00; retval = retval + 1) {
    printf("%g ",xf[retval]);
  }
  for (retval = 0; retval < p; retval = retval + 1) {
    phi[retval] = xf[retval];
  }
  for (retval = 0; retval < q; retval = retval + 1) {
    theta[retval] = xf[p + retval];
  }
  if (*(int *)((long)as197_min.params + 0x1c) == 1) {
    *wmean = xf[p + q];
  }
  else {
    *wmean = 0.0;
  }
  for (retval = 0; retval < p_local - d; retval = retval + 1) {
    resid[retval] = *(double *)((long)as197_min.params + (long)(p_local + retval) * 8 + 0x680);
  }
  *var = *(double *)((long)as197_min.params + 0x30) / (double)p_local;
  free(xi);
  free(xf);
  free(oup);
  free_alik((alik_object)as197_min.params);
  return;
}

Assistant:

void as197(double *inp, int N, int optmethod, int p, int d, int q, double *phi, double *theta, double *wmean, double *var,double *resid,double *loglik,double *hess) {
	int i, pq, retval, length;
	double *b, *tf, *x;
	double maxstep;
	alik_object obj;
	//custom_function as154_min;

	x = (double*)malloc(sizeof(double)* (N - d));

	length = N;

	maxstep = 1.0;

	obj = alik_init(p, d, q, N);


	css(inp, N, optmethod, p, d, q, phi, theta, wmean, var,resid,loglik,hess);

	if (d > 0) {
		N = diff(inp, N, d, x); // No need to demean x
	}
	else {
		for (i = 0; i < N; ++i) {
			x[i] = inp[i];
		}
	}

	obj->N = N;
	obj->mean = *wmean;
	pq = obj->pq;
	b = (double*)malloc(sizeof(double)* pq);
	tf = (double*)malloc(sizeof(double)* pq);

	for (i = 0; i < p; ++i) {
		b[i] = phi[i];
	}
	for (i = 0; i < q; ++i) {
		b[p + i] = -theta[i];
	}

	if (obj->M == 1) {
		b[p + q] = obj->mean;
	}

	//mdisplay(b, 1, pq);

	for (i = 0; i < N; ++i) {
		obj->x[i] = obj->x[2 * N + i] = x[i];
	}
	for (i = N; i < 2 * N; ++i) {
		obj->x[i] = 0.0;
	}

	custom_function as197_min = { fas197, obj };
	retval = fminunc(&as197_min, NULL, pq, b, maxstep, optmethod, tf);

	for (i = 0; i < pq; ++i) {
		printf("%g ", tf[i]);
	}

	for (i = 0; i < p; ++i) {
		phi[i] = tf[i];
	}
	for (i = 0; i < q; ++i) {
		theta[i] = tf[p + i];
	}
	if (obj->M == 1) {
		*wmean = tf[p + q];
	}
	else {
		*wmean = 0.0;
	}
	for (i = 0; i < N - d; ++i) {
		resid[i] = obj->x[N + i];
	}
	*var = (obj->ssq) / (double)N;


	free(b);
	free(tf);
	free(x);
	free_alik(obj);
}